

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::TPZCompElWithMem
          (TPZCompElWithMem<TPZInterfaceElement> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZInterfaceElement> *copy)

{
  TPZRegisterClassId *in_RDI;
  TPZInterfaceElement *in_stack_00000078;
  TPZCompMesh *in_stack_00000080;
  void **in_stack_00000088;
  TPZInterfaceElement *in_stack_00000090;
  TPZCompElWithMem<TPZInterfaceElement> *in_stack_ffffffffffffffc8;
  TPZCompElWithMem<TPZInterfaceElement> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElWithMem<TPZInterfaceElement>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024e9038);
  TPZInterfaceElement::TPZInterfaceElement
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024e8db0;
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024e8db0;
  TPZStack<long,_128>::TPZStack((TPZStack<long,_128> *)in_RDI);
  CopyIntPtIndicesFrom(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh, const TPZCompElWithMem<TBASE> &copy) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh, copy) {
    CopyIntPtIndicesFrom(copy);
}